

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

ptrdiff_t __thiscall pugi::xml_node::offset_debug(xml_node *this)

{
  ulong uVar1;
  uint uVar2;
  ptrdiff_t pVar3;
  xml_node_struct *pxVar4;
  long lVar5;
  xml_node local_10;
  
  if (this->_root == (xml_node_struct *)0x0) {
    xml_node(&local_10);
  }
  else {
    lVar5 = *(long *)(this->_root->header & 0xffffffffffffffe0);
    pxVar4 = (xml_node_struct *)(lVar5 + -0x40);
    if (lVar5 == 0) {
      pxVar4 = (xml_node_struct *)0x0;
    }
    xml_node(&local_10,pxVar4);
  }
  pVar3 = -1;
  if (((local_10._root != (xml_node_struct *)0x0) && (local_10._root[1].name != (char_t *)0x0)) &&
     (pxVar4 = this->_root, pxVar4 != (xml_node_struct *)0x0)) {
    uVar1 = pxVar4->header;
    uVar2 = (uint)uVar1 & 7;
    if ((0x9cU >> uVar2 & 1) == 0) {
      if ((0x62U >> uVar2 & 1) == 0) {
        return (ulong)uVar2;
      }
      lVar5 = 0x10;
      uVar1 = uVar1 & 0x10;
    }
    else {
      lVar5 = 0x18;
      uVar1 = uVar1 & 8;
    }
    pVar3 = -1;
    if (uVar1 == 0) {
      pVar3 = *(long *)((long)&pxVar4->header + lVar5) - (long)local_10._root[1].name;
    }
  }
  return pVar3;
}

Assistant:

PUGI__FN ptrdiff_t xml_node::offset_debug() const
	{
		xml_node_struct* r = root()._root;

		if (!r) return -1;

		const char_t* buffer = static_cast<impl::xml_document_struct*>(r)->buffer;

		if (!buffer) return -1;

		switch (type())
		{
		case node_document:
			return 0;

		case node_element:
		case node_declaration:
		case node_pi:
			return (_root->header & impl::xml_memory_page_name_allocated_mask) ? -1 : _root->name - buffer;

		case node_pcdata:
		case node_cdata:
		case node_comment:
		case node_doctype:
			return (_root->header & impl::xml_memory_page_value_allocated_mask) ? -1 : _root->value - buffer;

		default:
			return -1;
		}
	}